

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::CommissionerSafe::Init
          (Error *__return_storage_ptr__,CommissionerSafe *this,Config *aConfig)

{
  ErrorCode EVar1;
  int iVar2;
  char *pcVar3;
  Error *pEVar4;
  char *pcVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  format_args args_00;
  shared_ptr<ot::commissioner::CommissionerImpl> impl;
  string local_b8;
  undefined1 local_98 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  size_t local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  parse_func local_70 [1];
  timeval kDefaultNonIoEventTimeout;
  event_base *local_58;
  string local_50 [32];
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  impl.super___shared_ptr<ot::commissioner::CommissionerImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  impl.super___shared_ptr<ot::commissioner::CommissionerImpl,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  kDefaultNonIoEventTimeout.tv_sec = 0x15180;
  kDefaultNonIoEventTimeout.tv_usec = 0;
  if ((this->mEventBase).mEventBase == (event_base *)0x0) {
    local_98._0_4_ = none_type;
    local_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2178a0;
    local_88 = 0x1b;
    local_80._M_allocated_capacity = 0;
    local_70[0] = (parse_func)0x0;
    pcVar3 = "failed to create event base";
    local_80._8_8_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_98;
    while (pcVar5 = pcVar3, pcVar5 != "") {
      pcVar3 = pcVar5 + 1;
      if (*pcVar5 == '}') {
        if ((pcVar3 == "") || (*pcVar3 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar3 = pcVar5 + 2;
      }
      else if (*pcVar5 == '{') {
        pcVar3 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar5,"",
                            (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_98);
      }
    }
    args_00.field_1.values_ = in_R9.values_;
    args_00.desc_ = (unsigned_long_long)local_98;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_b8,(v10 *)"failed to create event base",(string_view)ZEXT816(0x1b),args_00);
    local_58 = (event_base *)CONCAT44(local_58._4_4_,10);
    std::__cxx11::string::string(local_50,(string *)&local_b8);
    Error::operator=(__return_storage_ptr__,(Error *)&local_58);
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  else {
    local_98._0_4_ = none_type;
    local_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2178bc;
    local_88 = 0x1f;
    local_80._M_allocated_capacity = 0;
    local_70[0] = (parse_func)0x0;
    pcVar3 = "failed to initialize event base";
    local_80._8_8_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_98;
    while (pcVar5 = pcVar3, pcVar5 != "") {
      pcVar3 = pcVar5 + 1;
      if (*pcVar5 == '}') {
        if ((pcVar3 == "") || (*pcVar3 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar3 = pcVar5 + 2;
      }
      else if (*pcVar5 == '{') {
        pcVar3 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar5,"",
                            (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_98);
      }
    }
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_98;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_b8,(v10 *)"failed to initialize event base",(string_view)ZEXT816(0x1f),args);
    local_58 = (event_base *)CONCAT44(local_58._4_4_,0x13);
    std::__cxx11::string::string(local_50,(string *)&local_b8);
    Error::operator=(__return_storage_ptr__,(Error *)&local_58);
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::~string((string *)&local_b8);
    iVar2 = evthread_use_pthreads();
    if (iVar2 == 0) {
      iVar2 = evthread_make_base_notifiable((this->mEventBase).mEventBase);
      if (iVar2 == 0) {
        iVar2 = event_assign(&this->mInvokeEvent,(this->mEventBase).mEventBase,-1,0x10,Invoke,this);
        if (iVar2 == 0) {
          iVar2 = event_add(&this->mInvokeEvent,&kDefaultNonIoEventTimeout);
          if (iVar2 == 0) {
            local_58 = (this->mEventBase).mEventBase;
            std::
            make_shared<ot::commissioner::CommissionerImpl,ot::commissioner::CommissionerHandler&,event_base*>
                      ((CommissionerHandler *)local_98,(event_base **)this->mHandler);
            std::__shared_ptr<ot::commissioner::CommissionerImpl,_(__gnu_cxx::_Lock_policy)2>::
            operator=(&impl.
                       super___shared_ptr<ot::commissioner::CommissionerImpl,_(__gnu_cxx::_Lock_policy)2>
                      ,(__shared_ptr<ot::commissioner::CommissionerImpl,_(__gnu_cxx::_Lock_policy)2>
                        *)local_98);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90);
            (*((impl.
                super___shared_ptr<ot::commissioner::CommissionerImpl,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->super_Commissioner)._vptr_Commissioner[2])
                      (local_98,impl.
                                super___shared_ptr<ot::commissioner::CommissionerImpl,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr,aConfig);
            pEVar4 = Error::operator=(__return_storage_ptr__,(Error *)local_98);
            EVar1 = pEVar4->mCode;
            std::__cxx11::string::~string((string *)&local_90);
            if (EVar1 == kNone) {
              std::__shared_ptr<ot::commissioner::CommissionerImpl,_(__gnu_cxx::_Lock_policy)2>::
              operator=(&(this->mImpl).
                         super___shared_ptr<ot::commissioner::CommissionerImpl,_(__gnu_cxx::_Lock_policy)2>
                        ,&impl.
                          super___shared_ptr<ot::commissioner::CommissionerImpl,_(__gnu_cxx::_Lock_policy)2>
                       );
              StartEventLoopThread(this);
            }
          }
        }
      }
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&impl.
              super___shared_ptr<ot::commissioner::CommissionerImpl,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerSafe::Init(const Config &aConfig)
{
    Error                             error;
    std::shared_ptr<CommissionerImpl> impl;

    // The default timeout value (1 day) for non-IO events (events with fd < 0).
    constexpr struct timeval kDefaultNonIoEventTimeout = {3600 * 24, 0};

    VerifyOrExit(mEventBase.Get() != nullptr, error = ERROR_OUT_OF_MEMORY("failed to create event base"));

    error = ERROR_UNKNOWN("failed to initialize event base");
    VerifyOrExit(evthread_use_pthreads() == 0);
    VerifyOrExit(evthread_make_base_notifiable(mEventBase.Get()) == 0);
    VerifyOrExit(event_assign(&mInvokeEvent, mEventBase.Get(), -1, EV_PERSIST, Invoke, this) == 0);

    // We add the event with a timeout value so that the event loop will not
    // exit prematurely because of no events.
    VerifyOrExit(event_add(&mInvokeEvent, &kDefaultNonIoEventTimeout) == 0);

    impl = std::make_shared<CommissionerImpl>(mHandler, mEventBase.Get());
    SuccessOrExit(error = impl->Init(aConfig));
    mImpl = impl;

    StartEventLoopThread();

exit:
    return error;
}